

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculation.c
# Opt level: O0

void fill_mesh_at_initial_time
               (double *G,double *V,_func_double_double *g,_func_double_double *v,
               double *space_coordinates,uint space_nodes)

{
  double dVar1;
  uint local_38;
  uint space_step;
  uint space_nodes_local;
  double *space_coordinates_local;
  _func_double_double *v_local;
  _func_double_double *g_local;
  double *V_local;
  double *G_local;
  
  for (local_38 = 0; local_38 < space_nodes; local_38 = local_38 + 1) {
    dVar1 = (*g)(space_coordinates[local_38]);
    G[local_38] = dVar1;
    dVar1 = (*v)(space_coordinates[local_38]);
    V[local_38] = dVar1;
  }
  return;
}

Assistant:

void fill_mesh_at_initial_time (
    double * G,
    double * V,
    double (*g) (double), // log (ro_0)
    double (*v) (double), // u_0
    double const * space_coordinates,
    unsigned space_nodes) {
  register unsigned space_step = 0;
  for (space_step = 0; space_step < space_nodes; ++space_step) {
    G[space_step] = g(space_coordinates[space_step]);
    V[space_step] = v(space_coordinates[space_step]);
  }
  return;
}